

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O2

int default_stream_scheduler_do_send
              (quicly_stream_scheduler_t *self,quicly_conn_t *conn,quicly_send_context_t *s)

{
  st_quicly_default_scheduler_state_t *sched;
  quicly_stream_t *stream;
  quicly_linklist_t *n;
  st_quicly_linklist_t *psVar1;
  st_quicly_linklist_t *psVar2;
  int conn_is_blocked;
  int iVar3;
  
  sched = &(conn->super)._default_scheduler;
  conn_is_blocked = quicly_is_blocked(conn);
  if (conn_is_blocked == 0) {
    quicly_linklist_insert_list(&sched->active,&(conn->super)._default_scheduler.blocked);
  }
  while( true ) {
    iVar3 = quicly_can_send_data(conn,s);
    if (iVar3 == 0) {
      return 0;
    }
    if ((st_quicly_default_scheduler_state_t *)(sched->active).prev == sched) break;
    n = (conn->super)._default_scheduler.active.next;
    stream = (quicly_stream_t *)(n + -0x11);
    psVar1 = n->prev;
    psVar2 = n->next;
    psVar1->next = psVar2;
    psVar2->prev = psVar1;
    n->next = n;
    n->prev = n;
    if ((conn_is_blocked == 0) || (iVar3 = quicly_stream_can_send(stream,0), iVar3 != 0)) {
      iVar3 = quicly_send_stream(stream,s);
      if (iVar3 != 0) {
        if (iVar3 == 0xff02) {
          iVar3 = quicly_stream_can_send(stream,1);
          if (iVar3 == 0) {
            __assert_fail("quicly_stream_can_send(stream, 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                          ,0x137,
                          "int default_stream_scheduler_do_send(quicly_stream_scheduler_t *, quicly_conn_t *, quicly_send_context_t *)"
                         );
          }
          link_stream(sched,stream,conn_is_blocked);
          iVar3 = 0xff02;
        }
        return iVar3;
      }
      conn_is_blocked = quicly_is_blocked(conn);
      iVar3 = quicly_stream_can_send(stream,1);
      if (iVar3 != 0) {
        link_stream(sched,stream,conn_is_blocked);
      }
    }
    else {
      quicly_linklist_insert((conn->super)._default_scheduler.blocked.prev,n);
    }
  }
  return 0;
}

Assistant:

static int default_stream_scheduler_do_send(quicly_stream_scheduler_t *self, quicly_conn_t *conn, quicly_send_context_t *s)
{
    struct st_quicly_default_scheduler_state_t *sched = &((struct _st_quicly_conn_public_t *)conn)->_default_scheduler;
    int conn_is_blocked = quicly_is_blocked(conn), ret = 0;

    if (!conn_is_blocked)
        quicly_linklist_insert_list(&sched->active, &sched->blocked);

    while (quicly_can_send_data((quicly_conn_t *)conn, s) && quicly_linklist_is_linked(&sched->active)) {
        /* detach the first active stream */
        quicly_stream_t *stream =
            (void *)((char *)sched->active.next - offsetof(quicly_stream_t, _send_aux.pending_link.default_scheduler));
        quicly_linklist_unlink(&stream->_send_aux.pending_link.default_scheduler);
        /* relink the stream to the blocked list if necessary */
        if (conn_is_blocked && !quicly_stream_can_send(stream, 0)) {
            quicly_linklist_insert(sched->blocked.prev, &stream->_send_aux.pending_link.default_scheduler);
            continue;
        }
        /* send! */
        if ((ret = quicly_send_stream(stream, s)) != 0) {
            /* FIXME Stop quicly_send_stream emitting SENDBUF_FULL (happpens when CWND is congested). Otherwise, we need to make
             * adjustments to the scheduler after popping a stream */
            if (ret == QUICLY_ERROR_SENDBUF_FULL) {
                assert(quicly_stream_can_send(stream, 1));
                link_stream(sched, stream, conn_is_blocked);
            }
            break;
        }
        /* reschedule */
        conn_is_blocked = quicly_is_blocked(conn);
        if (quicly_stream_can_send(stream, 1))
            link_stream(sched, stream, conn_is_blocked);
    }

    return ret;
}